

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_predictor_32x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  uint8_t *puVar2;
  bool bVar3;
  undefined1 uVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar5;
  undefined1 uVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  short local_28;
  short sStack_26;
  
  auVar6 = psadbw(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar8 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(above + 0x10));
  dc_sum_64(left);
  iVar1 = (CONCAT22((short)((uint)extraout_XMM0_Da >> 0x10) + auVar8._2_2_ + auVar6._2_2_ +
                    sStack_26,(short)extraout_XMM0_Da + auVar8._0_2_ + auVar6._0_2_ + local_28) +
           0x30U >> 5) * 0x5556;
  uVar7 = (undefined1)((uint)iVar1 >> 0x18);
  uVar4 = (undefined1)((uint)iVar1 >> 0x10);
  auVar6 = ZEXT416(CONCAT22(CONCAT11(uVar7,uVar7),CONCAT11(uVar4,uVar4)));
  auVar6 = pshuflw(auVar6,auVar6,0);
  uVar5 = auVar6._0_4_;
  puVar2 = dst + 0x10;
  iVar1 = 0x40;
  while (bVar3 = iVar1 != 0, iVar1 = iVar1 + -1, bVar3) {
    *(undefined4 *)(puVar2 + -0x10) = uVar5;
    *(undefined4 *)(puVar2 + -0xc) = uVar5;
    *(undefined4 *)(puVar2 + -8) = uVar5;
    *(undefined4 *)(puVar2 + -4) = uVar5;
    *(undefined4 *)puVar2 = uVar5;
    *(undefined4 *)(puVar2 + 4) = uVar5;
    *(undefined4 *)(puVar2 + 8) = uVar5;
    *(undefined4 *)(puVar2 + 0xc) = uVar5;
    puVar2 = puVar2 + stride;
  }
  return;
}

Assistant:

void aom_dc_predictor_32x64_sse2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  __m128i sum_above = dc_sum_32_sse2(above);
  const __m128i sum_left = dc_sum_64(left);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 48;
  sum = divide_using_multiply_shift(sum, 5, DC_MULTIPLIER_1X2);
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_32xh(&row, 64, dst, stride);
}